

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

Object * __thiscall GCPtr<symbols::Object>::operator=(GCPtr<symbols::Object> *this,Object *t)

{
  _List_node_base *p_Var1;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar2;
  
  plVar2 = &gclist_abi_cxx11_;
  do {
    plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
             (plVar2->
             super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar2 == &gclist_abi_cxx11_) break;
  } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)this->addr);
  *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + -1;
  plVar2 = &gclist_abi_cxx11_;
  do {
    plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
             (plVar2->
             super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar2 == &gclist_abi_cxx11_) {
      p_Var1 = (_List_node_base *)operator_new(0x20);
      *(undefined4 *)&p_Var1[1]._M_next = 1;
      p_Var1[1]._M_prev = (_List_node_base *)t;
      std::__detail::_List_node_base::_M_hook(p_Var1);
      gclist_abi_cxx11_.
      super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>._M_impl.
      _M_node._M_size =
           gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>.
           _M_impl._M_node._M_size + 1;
      goto LAB_0010d41a;
    }
  } while (*(_List_node_base **)((long)plVar2 + 0x10U + 8) != (_List_node_base *)t);
  *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + 1;
LAB_0010d41a:
  this->addr = t;
  return t;
}

Assistant:

T * GCPtr<T>::operator=(T *t){

    typename list<GCInfo<T>>::iterator p;
    // First, decrement the reference count
    // for the memory currently being pointed to.
    p = findPtrInfo(addr);
    p->refcount--;
    // Next, if the new address is already
    // existent in the system, increment its
    // count. Otherwise, create a new entry
    // for gclist.
    p = findPtrInfo(t);
    if(p != gclist.end())
        p->refcount++;
    else {
        // Create and store this entry.
        GCInfo<T> gcObj(t);
        gclist.push_front(gcObj);
    }
    addr = t; // store the address.
    return t;
}